

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

reentrant_put_transaction<Msg> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
::
start_reentrant_emplace<density_tests::LfQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
          (reentrant_put_transaction<Msg> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
          *this)

{
  Allocation push_data;
  Allocation local_50;
  reentrant_put_transaction<Msg> local_38;
  
  detail::
  LFQueue_Tail<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,24ul,8ul>
            (&local_50,this);
  local_50.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::LfQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
       ::s_table;
  (((time_point *)local_50.m_user_storage)->__d).__r = 0;
  *(size_t *)((long)local_50.m_user_storage + 8) = 0;
  *(void **)((long)local_50.m_user_storage + 0x10) = (void *)0x0;
  density_tests::
  LfQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples::Msg::Msg
            ((Msg *)local_50.m_user_storage);
  local_38.m_put.m_control_block = local_50.m_control_block;
  local_38.m_put.m_next_ptr = local_50.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_50.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_50.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_50.m_next_ptr;
  __return_storage_ptr__->m_queue =
       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        *)this;
  local_38.m_put.m_user_storage = (void *)0x0;
  local_38.m_queue =
       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        *)this;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::reentrant_put_transaction<Msg>::~reentrant_put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }